

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallHeapBlockAllocator.cpp
# Opt level: O2

void __thiscall
Memory::
SmallHeapBlockAllocator<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
::SetNew(SmallHeapBlockAllocator<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
         *this,SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *heapBlock)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  char *pcVar4;
  
  if (this->endAddress != (char *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.cpp"
                       ,0x96,"(this->endAddress == nullptr)","this->endAddress == nullptr");
    if (!bVar2) goto LAB_006ab1b8;
    *puVar3 = 0;
  }
  if (this->heapBlock !=
      (SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.cpp"
                       ,0x97,"(this->heapBlock == nullptr)","this->heapBlock == nullptr");
    if (!bVar2) goto LAB_006ab1b8;
    *puVar3 = 0;
  }
  if (this->freeObjectList != (FreeObject *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.cpp"
                       ,0x98,"(this->freeObjectList == nullptr)","this->freeObjectList == nullptr");
    if (!bVar2) goto LAB_006ab1b8;
    *puVar3 = 0;
  }
  if (heapBlock == (SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.cpp"
                       ,0x9a,"(heapBlock != nullptr)","heapBlock != nullptr");
    if (!bVar2) goto LAB_006ab1b8;
    *puVar3 = 0;
  }
  if ((heapBlock->super_SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>).
      super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>.
      super_SmallHeapBlockT<SmallAllocationBlockAttributes>.freeObjectList != (FreeObject *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.cpp"
                       ,0x9b,"(heapBlock->freeObjectList == nullptr)",
                       "heapBlock->freeObjectList == nullptr");
    if (!bVar2) goto LAB_006ab1b8;
    *puVar3 = 0;
  }
  if ((heapBlock->super_SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>).
      super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>.
      super_SmallHeapBlockT<SmallAllocationBlockAttributes>.lastFreeCount == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.cpp"
                       ,0x9c,"(heapBlock->lastFreeCount != 0)","heapBlock->lastFreeCount != 0");
    if (!bVar2) goto LAB_006ab1b8;
    *puVar3 = 0;
  }
  if ((heapBlock->super_SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>).
      super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>.
      super_SmallHeapBlockT<SmallAllocationBlockAttributes>.isInAllocator == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.cpp"
                       ,0x9e,"(!heapBlock->isInAllocator)","!heapBlock->isInAllocator");
    if (!bVar2) {
LAB_006ab1b8:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  (heapBlock->super_SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>).
  super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>.
  super_SmallHeapBlockT<SmallAllocationBlockAttributes>.isInAllocator = true;
  this->heapBlock = heapBlock;
  this->freeObjectList =
       (FreeObject *)
       (heapBlock->super_SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>).
       super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>.
       super_SmallHeapBlockT<SmallAllocationBlockAttributes>.super_HeapBlock.address;
  pcVar4 = SmallHeapBlockT<SmallAllocationBlockAttributes>::GetEndAddress
                     ((SmallHeapBlockT<SmallAllocationBlockAttributes> *)heapBlock);
  this->endAddress = pcVar4;
  return;
}

Assistant:

void
SmallHeapBlockAllocator<TBlockType>::SetNew(BlockType * heapBlock)
{
    Assert(this->endAddress == nullptr);
    Assert(this->heapBlock == nullptr);
    Assert(this->freeObjectList == nullptr);

    Assert(heapBlock != nullptr);
    Assert(heapBlock->freeObjectList == nullptr);
    Assert(heapBlock->lastFreeCount != 0);

    Assert(!heapBlock->isInAllocator);
    heapBlock->isInAllocator = true;

    this->heapBlock = heapBlock;
    this->freeObjectList = (FreeObject *)heapBlock->GetAddress();
    this->endAddress = heapBlock->GetEndAddress();

#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP 
    DebugOnly(this->isAllocatingFromNewBlock = true);
#endif
}